

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O3

void __thiscall
TPZParFrontMatrix<long_double,_TPZFileEqnStorage<long_double>,_TPZFrontSym<long_double>_>::
TPZParFrontMatrix(TPZParFrontMatrix<long_double,_TPZFileEqnStorage<long_double>,_TPZFrontSym<long_double>_>
                  *this,int64_t globalsize)

{
  TPZFrontMatrix<long_double,_TPZFileEqnStorage<long_double>,_TPZFrontSym<long_double>_>::
  TPZFrontMatrix(&this->
                  super_TPZFrontMatrix<long_double,_TPZFileEqnStorage<long_double>,_TPZFrontSym<long_double>_>
                 ,&PTR_PTR_01991810,globalsize);
  (this->
  super_TPZFrontMatrix<long_double,_TPZFileEqnStorage<long_double>,_TPZFrontSym<long_double>_>).
  super_TPZAbstractFrontMatrix<long_double>.super_TPZMatrix<long_double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZParFrontMatrix_01991588;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<long_double>_*,_10>.
  super_TPZVec<TPZEqnArray<long_double>_*>.fStore =
       (this->fEqnStack).super_TPZManVector<TPZEqnArray<long_double>_*,_10>.fExtAlloc;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<long_double>_*,_10>.
  super_TPZVec<TPZEqnArray<long_double>_*>.fNElements = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<long_double>_*,_10>.
  super_TPZVec<TPZEqnArray<long_double>_*>.fNAlloc = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<long_double>_*,_10>.
  super_TPZVec<TPZEqnArray<long_double>_*>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019a1f98;
  this->fFinish = 0;
  (this->fwritelock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fwritelock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->fwritelock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->fwritelock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->fwritelock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->fwritecond);
  TPZManVector<TPZEqnArray<long_double>_*,_10>::Resize
            (&(this->fEqnStack).super_TPZManVector<TPZEqnArray<long_double>_*,_10>,0);
  return;
}

Assistant:

TPZParFrontMatrix<TVar, store, front>::TPZParFrontMatrix(int64_t globalsize) :
TPZRegisterClassId(&TPZParFrontMatrix::ClassId), TPZFrontMatrix<TVar, store, front>(globalsize),
fFinish(0), fwritelock(), fwritecond()
{
	fEqnStack.Resize(0);
}